

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,string *name,
          vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
          *arguments,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  bool bVar1;
  reference this_00;
  pointer pFVar2;
  string *psVar3;
  unique_ptr *this_01;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *__range1;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *local_28;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *body_local;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *arguments_local;
  string *name_local;
  FunctionDefinition *this_local;
  
  local_28 = body;
  body_local = (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)arguments;
  arguments_local =
       (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
        *)name;
  name_local = (string *)this;
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__FunctionDefinition_00288e58;
  std::__cxx11::string::string((string *)&this->name,(string *)arguments_local);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::vector(&this->arguments,arguments);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::unique_ptr(&this->body,body);
  std::
  function<std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>(ninx::parser::element::Block*,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>)>
  ::
  function<ninx::parser::element::FunctionDefinition::evaluator::_lambda(ninx::parser::element::Block*,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>)_1_,void>
            ((function<std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>(ninx::parser::element::Block*,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>)>
              *)&this->evaluator,(anon_class_1_0_00000001 *)((long)&__range1 + 3));
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->mandatory_arguments);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->_argument_name_cache);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ::begin(&this->arguments);
  argument = (unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
              *)std::
                vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ::end(&this->arguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
                                *)&argument);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
              ::operator*(&__end1);
    pFVar2 = std::
             unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ::operator->(this_00);
    psVar3 = FunctionArgument::get_name_abi_cxx11_(pFVar2);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->_argument_name_cache,psVar3);
    pFVar2 = std::
             unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ::operator->(this_00);
    this_01 = (unique_ptr *)FunctionArgument::get_default_value(pFVar2);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_01);
    if (!bVar1) {
      pFVar2 = std::
               unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               ::operator->(this_00);
      psVar3 = FunctionArgument::get_name_abi_cxx11_(pFVar2);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->mandatory_arguments,psVar3);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

ninx::parser::element::FunctionDefinition::FunctionDefinition(const std::string &name,
                                                              std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument>> arguments,
                                                              std::unique_ptr<ninx::parser::element::Block> body)
        : name(name), arguments(std::move(arguments)), body(std::move(body)) {

    // Populate the caches
    for (auto &argument : this->arguments) {
        this->_argument_name_cache.insert(argument->get_name());

        if (!argument->get_default_value()) {
            this->mandatory_arguments.insert(argument->get_name());
        }
    }
}